

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O1

bool __thiscall
lambertian::scatter(lambertian *this,ray *r_in,hit_record *rec,color *attenuation,ray *scattered)

{
  double dVar1;
  element_type *peVar2;
  double dVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  vec3 p;
  double local_48;
  double dStack_40;
  double local_38;
  
  vec3::random();
  dVar8 = local_38 * local_38 + local_48 * local_48 + dStack_40 * dStack_40;
  while ((dVar8 <= 1e-160 || (1.0 < dVar8))) {
    vec3::random();
    dVar8 = local_38 * local_38 + local_48 * local_48 + dStack_40 * dStack_40;
  }
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  dVar8 = 1.0 / dVar8;
  dVar1 = (rec->normal).e[0];
  dVar11 = local_48 * dVar8 + dVar1;
  dVar9 = (rec->normal).e[1];
  dVar3 = dStack_40 * dVar8 + dVar9;
  dVar10 = (rec->normal).e[2];
  dVar8 = dVar8 * local_38 + dVar10;
  if ((1e-08 <= ABS(dVar3) || 1e-08 <= ABS(dVar11)) || 1e-08 <= ABS(dVar8)) {
    dVar9 = dVar3;
    dVar10 = dVar8;
    dVar1 = dVar11;
  }
  dVar8 = r_in->tm;
  uVar4 = *(undefined4 *)(rec->p).e;
  uVar5 = *(undefined4 *)((long)(rec->p).e + 4);
  uVar6 = *(undefined4 *)((rec->p).e + 1);
  uVar7 = *(undefined4 *)((long)(rec->p).e + 0xc);
  (scattered->orig).e[2] = (rec->p).e[2];
  *(undefined4 *)(scattered->orig).e = uVar4;
  *(undefined4 *)((long)(scattered->orig).e + 4) = uVar5;
  *(undefined4 *)((scattered->orig).e + 1) = uVar6;
  *(undefined4 *)((long)(scattered->orig).e + 0xc) = uVar7;
  (scattered->dir).e[0] = dVar1;
  (scattered->dir).e[1] = dVar9;
  (scattered->dir).e[2] = dVar10;
  scattered->tm = dVar8;
  peVar2 = (this->tex).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_texture[2])(SUB84(rec->u,0),rec->v,&local_48,peVar2,rec);
  attenuation->e[2] = local_38;
  attenuation->e[0] = local_48;
  attenuation->e[1] = dStack_40;
  return true;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, color& attenuation, ray& scattered)
    const override {
        auto scatter_direction = rec.normal + random_unit_vector();

        // Catch degenerate scatter direction
        if (scatter_direction.near_zero())
            scatter_direction = rec.normal;

        scattered = ray(rec.p, scatter_direction, r_in.time());
        attenuation = tex->value(rec.u, rec.v, rec.p);
        return true;
    }